

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_fee.cpp
# Opt level: O0

Amount cfd::FeeCalculator::CalculateFee(uint32_t size,uint32_t vsize,uint64_t rate)

{
  long in_RDX;
  uint in_ESI;
  uint in_EDI;
  Amount AVar1;
  uint32_t use_size;
  int64_t satoshi;
  uint local_44;
  ulong local_28;
  
  local_44 = in_EDI;
  if ((in_ESI != 0) && (in_EDI != in_ESI)) {
    local_44 = in_ESI;
  }
  local_28 = ((ulong)local_44 * in_RDX) / 1000;
  if (local_28 < 1000) {
    local_28 = 1000;
  }
  AVar1 = core::Amount::CreateBySatoshiAmount(local_28);
  return AVar1;
}

Assistant:

Amount FeeCalculator::CalculateFee(  // Fee計算
    uint32_t size, uint32_t vsize, uint64_t rate) {
  int64_t satoshi;
  uint32_t use_size = ((vsize != 0) && (size != vsize)) ? vsize : size;
  satoshi = use_size * rate / kKiloByteSize;
  if (satoshi < kRelayMinimumFee) {
    satoshi = kRelayMinimumFee;
  }
  return Amount::CreateBySatoshiAmount(satoshi);
}